

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  int iVar1;
  ImDrawChannel *pIVar2;
  long lVar3;
  ImDrawChannel *pIVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int i;
  long lVar9;
  ImDrawCmd *__dest;
  
  if (1 < this->_ChannelsCount) {
    iVar6 = 0;
    ChannelsSetCurrent(this,0);
    iVar1 = (this->CmdBuffer).Size;
    if (((long)iVar1 != 0) && ((this->CmdBuffer).Data[(long)iVar1 + -1].ElemCount == 0)) {
      (this->CmdBuffer).Size = iVar1 + -1;
    }
    iVar1 = this->_ChannelsCount;
    iVar8 = 0;
    pIVar2 = (this->_Channels).Data;
    for (lVar5 = 1; pIVar4 = pIVar2 + 1, lVar5 < iVar1; lVar5 = lVar5 + 1) {
      iVar7 = (pIVar4->CmdBuffer).Size;
      if ((long)iVar7 == 0) {
        iVar7 = 0;
      }
      else if (pIVar2[1].CmdBuffer.Data[(long)iVar7 + -1].ElemCount == 0) {
        iVar7 = iVar7 + -1;
        (pIVar4->CmdBuffer).Size = iVar7;
      }
      iVar6 = iVar6 + pIVar2[1].IdxBuffer.Size;
      iVar8 = iVar7 + iVar8;
      pIVar2 = pIVar4;
    }
    ImVector<ImDrawCmd>::resize(&this->CmdBuffer,(this->CmdBuffer).Size + iVar8);
    ImVector<unsigned_short>::resize(&this->IdxBuffer,(this->IdxBuffer).Size + iVar6);
    __dest = (this->CmdBuffer).Data + ((long)(this->CmdBuffer).Size - (long)iVar8);
    this->_IdxWritePtr = (this->IdxBuffer).Data + ((long)(this->IdxBuffer).Size - (long)iVar6);
    lVar9 = 0x38;
    for (lVar5 = 1; lVar5 < this->_ChannelsCount; lVar5 = lVar5 + 1) {
      pIVar2 = (this->_Channels).Data;
      lVar3 = (long)*(int *)((long)pIVar2 + lVar9 + -0x18);
      if (lVar3 != 0) {
        memcpy(__dest,*(void **)((long)pIVar2 + lVar9 + -0x10),lVar3 * 0x30);
        __dest = __dest + lVar3;
      }
      lVar3 = (long)*(int *)((long)pIVar2 + lVar9 + -8);
      if (lVar3 != 0) {
        memcpy(this->_IdxWritePtr,*(void **)((long)&(pIVar2->CmdBuffer).Size + lVar9),lVar3 * 2);
        this->_IdxWritePtr = this->_IdxWritePtr + lVar3;
      }
      lVar9 = lVar9 + 0x20;
    }
    UpdateClipRect(this);
    this->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    _ChannelsCount = 1;
}